

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.hpp
# Opt level: O2

void jsonip::grammar::member_name::
     process_match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>,std::pair<char_const*,long>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state,
               pair<const_char_*,_long> *mp)

{
  undefined1 local_38 [8];
  string s;
  
  local_38 = (undefined1  [8])&s._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,mp->first + 1,mp->first + mp->second + -1);
  parser::decode_string((string *)local_38);
  semantic_state::new_member(state->ss_,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

static inline void process_match (S& state, match_pair const& mp)
        {
            std::string s = state.to_string(mp.first + typename S::OffsetType(1), mp.second - 2);
            decode_string(s);
            state.semantic_state().new_member(s);
        }